

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_node.cpp
# Opt level: O1

void dumpToList_prefix(Node *n,vector<rengine::Node_*,_std::allocator<rengine::Node_*>_> *list)

{
  pointer *pppNVar1;
  iterator __position;
  Node *n_00;
  Node *local_20;
  Node *n_local;
  
  __position._M_current =
       (list->super__Vector_base<rengine::Node_*,_std::allocator<rengine::Node_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = n;
  if (__position._M_current ==
      (list->super__Vector_base<rengine::Node_*,_std::allocator<rengine::Node_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<rengine::Node*,std::allocator<rengine::Node*>>::
    _M_realloc_insert<rengine::Node*const&>
              ((vector<rengine::Node*,std::allocator<rengine::Node*>> *)list,__position,&local_20);
  }
  else {
    *__position._M_current = n;
    pppNVar1 = &(list->super__Vector_base<rengine::Node_*,_std::allocator<rengine::Node_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  for (n_00 = local_20->m_child; n_00 != (Node *)0x0; n_00 = rengine::Node::sibling(n_00)) {
    dumpToList_prefix(n_00,list);
  }
  return;
}

Assistant:

static void dumpToList_prefix(Node *n, std::vector<Node *> &list)
{
    list.push_back(n);
    Node *c = n->child();
    while (c) {
        dumpToList_prefix(c, list);
        c = c->sibling();
    }
}